

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O3

void recall_tree_ns::learn(recall_tree *b,single_learner *base,example *ec)

{
  uchar **ppuVar1;
  uint64_t *puVar2;
  node *pnVar3;
  uint cn;
  uint32_t uVar4;
  node_pred *pnVar5;
  predict_type pVar6;
  node *pnVar7;
  uint64_t uVar8;
  node_pred *pnVar9;
  node_pred *pnVar10;
  uint cn_00;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  
  pVar6 = predict_from(b,base,ec,0);
  (ec->pred).multiclass = pVar6.class_prediction;
  if (b->all->training != true) {
    return;
  }
  if ((ec->l).multi.label == 0xffffffff) {
    return;
  }
  pnVar7 = (b->nodes)._begin;
  uVar12 = 0;
  if (pnVar7->internal == true) {
    uVar13 = 0;
    cn_00 = 0;
    do {
      fVar14 = train_node(b,base,ec,cn_00);
      if (b->randomized_routing == true) {
        fVar15 = merand48(&b->all->random_state);
        fVar14 = (fVar14 + fVar14 + 1.0) * 0.5;
        if (1.0 <= fVar14) {
          fVar14 = 1.0;
        }
        if (fVar14 <= 0.0) {
          fVar14 = 0.0;
        }
        fVar14 = *(float *)(&DAT_0027fd38 + (ulong)(fVar14 < fVar15) * 4);
      }
      pnVar7 = (b->nodes)._begin;
      cn = (&pnVar7[uVar13].left)[0.0 <= fVar14];
      uVar12 = (ulong)cn;
      if (b->bern_hyper <= 0.0) {
        insert_example_at_node(b,cn_00,ec);
      }
      else {
        fVar14 = pnVar7[uVar13].recall_lbest;
        fVar15 = pnVar7[uVar12].recall_lbest;
        insert_example_at_node(b,cn_00,ec);
        if (fVar15 <= fVar14) {
          insert_example_at_node(b,cn,ec);
          pnVar7 = (b->nodes)._begin;
          uVar12 = (ulong)cn_00;
          break;
        }
      }
      pnVar7 = (b->nodes)._begin;
      uVar13 = uVar12;
      cn_00 = cn;
    } while (pnVar7[uVar12].internal != false);
  }
  if (pnVar7[uVar12].internal == false) {
    insert_example_at_node(b,(uint32_t)uVar12,ec);
    pnVar7 = (b->nodes)._begin;
  }
  pnVar9 = pnVar7[uVar12].preds._begin;
  pnVar5 = pnVar7[uVar12].preds._end;
  if (pnVar9 == pnVar5) {
    return;
  }
  pnVar10 = pnVar9 + b->max_candidates;
  uVar4 = (ec->l).multi.label;
  while( true ) {
    if (pnVar10 <= pnVar9) {
      return;
    }
    if (pnVar9->label == uVar4) break;
    pnVar9 = pnVar9 + 1;
    if (pnVar9 == pnVar5) {
      return;
    }
  }
  fVar14 = (ec->l).simple.weight;
  fVar15 = (ec->pred).scalar;
  add_node_id_feature(b,(uint32_t)uVar12,ec);
  (ec->l).cs.costs._begin = (wclass *)0x3f8000003f800000;
  (ec->l).simple.initial = 0.0;
  iVar11 = (int)b->max_routers + uVar4 + -1;
  puVar2 = &(ec->super_example_predict).ft_offset;
  *puVar2 = *puVar2 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar11);
  (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  uVar8 = (ec->super_example_predict).ft_offset - (ulong)(uint)(iVar11 * *(int *)(base + 0xe0));
  (ec->super_example_predict).ft_offset = uVar8;
  (ec->l).cs.costs._begin = (wclass *)0x3f800000bf800000;
  (ec->l).simple.initial = 0.0;
  pnVar7 = (b->nodes)._begin;
  pnVar9 = pnVar7[uVar12].preds._begin;
  if (pnVar9 != pnVar7[uVar12].preds._end) {
    pnVar3 = pnVar7 + uVar12;
    do {
      if ((pnVar3->preds)._begin + b->max_candidates <= pnVar9) break;
      if (pnVar9->label != uVar4) {
        iVar11 = pnVar9->label + (int)b->max_routers + -1;
        (ec->super_example_predict).ft_offset = (uint)(*(int *)(base + 0xe0) * iVar11) + uVar8;
        (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        uVar8 = (ec->super_example_predict).ft_offset -
                (ulong)(uint)(iVar11 * *(int *)(base + 0xe0));
        (ec->super_example_predict).ft_offset = uVar8;
        pnVar7 = (b->nodes)._begin;
      }
      pnVar9 = pnVar9 + 1;
      pnVar3 = pnVar7 + uVar12;
    } while (pnVar9 != (pnVar3->preds)._end);
  }
  features::clear((ec->super_example_predict).feature_space + 0x88);
  ppuVar1 = &(ec->super_example_predict).indices._end;
  *ppuVar1 = *ppuVar1 + -1;
  (ec->l).multi.label = uVar4;
  (ec->l).simple.weight = fVar14;
  (ec->pred).scalar = fVar15;
  return;
}

Assistant:

void learn(recall_tree& b, single_learner& base, example& ec)
{
  predict(b, base, ec);

  if (b.all->training && ec.l.multi.label != (uint32_t)-1)  // if training the tree
  {
    uint32_t cn = 0;

    while (b.nodes[cn].internal)
    {
      float which = train_node(b, base, ec, cn);

      if (b.randomized_routing)
        which = (merand48(b.all->random_state) > to_prob(which) ? -1.f : 1.f);

      uint32_t newcn = descend(b.nodes[cn], which);
      bool cond = stop_recurse_check(b, cn, newcn);
      insert_example_at_node(b, cn, ec);

      if (cond)
      {
        insert_example_at_node(b, newcn, ec);
        break;
      }

      cn = newcn;
    }

    if (!b.nodes[cn].internal)
      insert_example_at_node(b, cn, ec);

    if (is_candidate(b, cn, ec))
    {
      MULTICLASS::label_t mc = ec.l.multi;
      uint32_t save_pred = ec.pred.multiclass;

      add_node_id_feature(b, cn, ec);

      ec.l.simple = {1.f, 1.f, 0.f};
      base.learn(ec, b.max_routers + mc.label - 1);
      ec.l.simple = {-1.f, 1.f, 0.f};

      for (node_pred* ls = b.nodes[cn].preds.begin();
           ls != b.nodes[cn].preds.end() && ls < b.nodes[cn].preds.begin() + b.max_candidates; ++ls)
      {
        if (ls->label != mc.label)
          base.learn(ec, b.max_routers + ls->label - 1);
      }

      remove_node_id_feature(b, cn, ec);

      ec.l.multi = mc;
      ec.pred.multiclass = save_pred;
    }
  }
}